

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetAggregateIDList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
          *AI)

{
  KUINT16 *pKVar1;
  KUINT16 KVar2;
  KUINT16 KVar3;
  undefined2 uVar4;
  KUINT16 KVar5;
  ushort uVar6;
  
  uVar4 = this->m_ui16NumAggregates;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + uVar4 * -6;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::operator=(&this->m_vAI,AI);
  KVar5 = (KUINT16)((uint)(*(int *)&(this->m_vAI).
                                    super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->m_vAI).
                                   super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
  this->m_ui16NumAggregates = KVar5;
  KVar2 = (this->super_Header).super_Header6.m_ui16PDULength;
  KVar3 = this->m_ui16NumberOfPaddingOctets;
  uVar6 = (this->m_ui16NumEntities + KVar5) * 2 & 2;
  this->m_ui16NumberOfPaddingOctets = uVar6;
  (this->super_Header).super_Header6.m_ui16PDULength = uVar6 + ((KVar5 * 6 + KVar2) - KVar3);
  return;
}

Assistant:

void Aggregate_State_PDU::SetAggregateIDList( const vector<AggregateIdentifier> & AI )
{
    // Reset the PDU length field
    m_ui16PDULength -= m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;

    m_vAI = AI;
    m_ui16NumAggregates = m_vAI.size();
    m_ui16PDULength += m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;
    updatePadding();
}